

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall duckdb::BitpackingState<long,_long>::Reset(BitpackingState<long,_long> *this)

{
  this->minimum = 0x7fffffffffffffff;
  this->minimum_delta = 0x7fffffffffffffff;
  this->maximum = -0x8000000000000000;
  this->maximum_delta = -0x8000000000000000;
  this->all_valid = true;
  this->all_invalid = true;
  this->can_do_delta = false;
  this->can_do_for = false;
  this->compression_buffer_idx = 0;
  this->min_max_diff = 0;
  this->min_max_delta_diff = 0;
  this->delta_offset = 0;
  return;
}

Assistant:

void Reset() {
		minimum = NumericLimits<T>::Maximum();
		minimum_delta = NumericLimits<T_S>::Maximum();
		maximum = NumericLimits<T>::Minimum();
		maximum_delta = NumericLimits<T_S>::Minimum();
		delta_offset = 0;
		all_valid = true;
		all_invalid = true;
		can_do_delta = false;
		can_do_for = false;
		compression_buffer_idx = 0;
		min_max_diff = 0;
		min_max_delta_diff = 0;
	}